

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitStore(PrintExpressionContents *this,Store *curr)

{
  byte bVar1;
  ulong uVar2;
  undefined8 in_RAX;
  long lVar3;
  Type type;
  char *pcVar4;
  ostream *poVar5;
  Module *in_R8;
  Name name;
  undefined8 uStack_28;
  
  poVar5 = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(poVar5,"\x1b[35m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  uVar2 = (curr->valueType).id;
  type.id = 2;
  if (2 < uVar2) {
    type.id = uVar2;
  }
  wasm::operator<<(poVar5,type);
  if (curr->isAtomic == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,".atomic",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,".store",6);
  bVar1 = curr->bytes;
  if ((3 < bVar1) && ((7 < bVar1 || ((curr->valueType).id != 3)))) goto LAB_00a2faf5;
  if (bVar1 == 4) {
    poVar5 = this->o;
    pcVar4 = "32";
LAB_00a2faeb:
    lVar3 = 2;
  }
  else if (bVar1 == 2) {
    poVar5 = this->o;
    if ((curr->valueType).id != 4) {
      pcVar4 = "16";
      goto LAB_00a2faeb;
    }
    pcVar4 = "_f16";
    lVar3 = 4;
  }
  else {
    if (bVar1 != 1) {
      abort();
    }
    poVar5 = this->o;
    pcVar4 = (char *)((long)&uStack_28 + 7);
    uStack_28 = CONCAT17(0x38,(undefined7)uStack_28);
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
LAB_00a2faf5:
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  if ((curr->align).addr != (ulong)curr->bytes) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," align=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    prepareColor(o) << forceConcrete(curr->valueType);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".store";
    if (curr->bytes < 4 || (curr->valueType == Type::i64 && curr->bytes < 8)) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->valueType == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }